

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::StmtFileNameVisitor::~StmtFileNameVisitor(StmtFileNameVisitor *this)

{
  ~StmtFileNameVisitor(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

explicit StmtFileNameVisitor(
        const std::map<const Stmt *, std::pair<std::string, uint32_t>> &stmt_fn_ln)
        : stmt_fn_ln_(stmt_fn_ln) {}